

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_file_async(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  uv_loop_t *puVar2;
  uv_fs_t *loop;
  char *pcVar3;
  uv_file add_flags;
  int iVar4;
  uv_fs_t *puVar5;
  char *unaff_R12;
  uv_fs_t *unaff_R14;
  uv_dirent_t *unaff_R15;
  uv_buf_t uVar6;
  uv_dirent_t dent;
  uv_dirent_t dent_00;
  uv_dirent_t uStackY_d8;
  uv_loop_t *puStackY_c8;
  char *pcStackY_c0;
  uv_fs_t *puStackY_b0;
  code *pcStackY_a8;
  code *pcStackY_a0;
  uv_dirent_t uStackY_98;
  char *pcStackY_88;
  
  unlink("test_file");
  unlink("test_file2");
  puVar2 = uv_default_loop();
  ::loop = puVar2;
  iVar1 = uv_fs_open(puVar2,&open_req1,"test_file",0x41,0x180,create_cb);
  if (iVar1 == 0) {
    puVar2 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (create_cb_count != 1) goto LAB_00159093;
    if (write_cb_count != 1) goto LAB_00159098;
    if (fsync_cb_count != 1) goto LAB_0015909d;
    if (fdatasync_cb_count != 1) goto LAB_001590a2;
    if (close_cb_count != 1) goto LAB_001590a7;
    puVar2 = ::loop;
    iVar1 = uv_fs_rename(::loop,&rename_req,"test_file","test_file2",rename_cb);
    if (iVar1 != 0) goto LAB_001590ac;
    puVar2 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (create_cb_count != 1) goto LAB_001590b1;
    if (write_cb_count != 1) goto LAB_001590b6;
    if (close_cb_count != 1) goto LAB_001590bb;
    if (rename_cb_count != 1) goto LAB_001590c0;
    puVar2 = ::loop;
    iVar1 = uv_fs_open(::loop,&open_req1,"test_file2",2,0,open_cb);
    if (iVar1 != 0) goto LAB_001590c5;
    puVar2 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (open_cb_count != 1) goto LAB_001590ca;
    if (read_cb_count != 1) goto LAB_001590cf;
    if (close_cb_count != 2) goto LAB_001590d4;
    if (rename_cb_count != 1) goto LAB_001590d9;
    if (create_cb_count != 1) goto LAB_001590de;
    if (write_cb_count != 1) goto LAB_001590e3;
    if (ftruncate_cb_count != 1) goto LAB_001590e8;
    puVar2 = ::loop;
    iVar1 = uv_fs_open(::loop,&open_req1,"test_file2",0,0,open_cb);
    if (iVar1 != 0) goto LAB_001590ed;
    puVar2 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (open_cb_count != 2) goto LAB_001590f2;
    if (read_cb_count != 2) goto LAB_001590f7;
    if (close_cb_count != 3) goto LAB_001590fc;
    if (rename_cb_count != 1) goto LAB_00159101;
    if (unlink_cb_count != 1) goto LAB_00159106;
    if (create_cb_count != 1) goto LAB_0015910b;
    if (write_cb_count != 1) goto LAB_00159110;
    if (ftruncate_cb_count != 1) goto LAB_00159115;
    unlink("test_file");
    unlink("test_file2");
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_file_async_cold_1();
LAB_00159093:
    run_test_fs_file_async_cold_2();
LAB_00159098:
    run_test_fs_file_async_cold_3();
LAB_0015909d:
    run_test_fs_file_async_cold_4();
LAB_001590a2:
    run_test_fs_file_async_cold_5();
LAB_001590a7:
    run_test_fs_file_async_cold_6();
LAB_001590ac:
    run_test_fs_file_async_cold_7();
LAB_001590b1:
    run_test_fs_file_async_cold_8();
LAB_001590b6:
    run_test_fs_file_async_cold_9();
LAB_001590bb:
    run_test_fs_file_async_cold_10();
LAB_001590c0:
    run_test_fs_file_async_cold_11();
LAB_001590c5:
    run_test_fs_file_async_cold_12();
LAB_001590ca:
    run_test_fs_file_async_cold_13();
LAB_001590cf:
    run_test_fs_file_async_cold_14();
LAB_001590d4:
    run_test_fs_file_async_cold_15();
LAB_001590d9:
    run_test_fs_file_async_cold_16();
LAB_001590de:
    run_test_fs_file_async_cold_17();
LAB_001590e3:
    run_test_fs_file_async_cold_18();
LAB_001590e8:
    run_test_fs_file_async_cold_19();
LAB_001590ed:
    run_test_fs_file_async_cold_20();
LAB_001590f2:
    run_test_fs_file_async_cold_21();
LAB_001590f7:
    run_test_fs_file_async_cold_22();
LAB_001590fc:
    run_test_fs_file_async_cold_23();
LAB_00159101:
    run_test_fs_file_async_cold_24();
LAB_00159106:
    run_test_fs_file_async_cold_25();
LAB_0015910b:
    run_test_fs_file_async_cold_26();
LAB_00159110:
    run_test_fs_file_async_cold_27();
LAB_00159115:
    run_test_fs_file_async_cold_28();
  }
  run_test_fs_file_async_cold_29();
  if (puVar2 == (uv_loop_t *)&open_req1) {
    if (open_req1.fs_type != UV_FS_OPEN) goto LAB_001591b7;
    if (open_req1.result._4_4_ < 0) goto LAB_001591bc;
    create_cb_count = create_cb_count + 1;
    uv_fs_req_cleanup(&open_req1);
    iov = uv_buf_init(test_buf,0xd);
    iVar4 = 0x160c4e;
    puVar2 = ::loop;
    iVar1 = uv_fs_write(::loop,&write_req,(uv_file)open_req1.result,&iov,1,-1,write_cb);
    if (iVar1 == 0) {
      return iVar4;
    }
  }
  else {
    create_cb_cold_1();
LAB_001591b7:
    create_cb_cold_2();
LAB_001591bc:
    create_cb_cold_3();
  }
  create_cb_cold_4();
  if (puVar2 == (uv_loop_t *)&rename_req) {
    if (rename_req.fs_type != UV_FS_RENAME) goto LAB_001591fe;
    if (rename_req.result == 0) {
      rename_cb_count = rename_cb_count + 1;
      uv_fs_req_cleanup(&rename_req);
      return extraout_EAX;
    }
  }
  else {
    rename_cb_cold_1();
LAB_001591fe:
    rename_cb_cold_2();
  }
  rename_cb_cold_3();
  if (puVar2 == (uv_loop_t *)&open_req1) {
    if (open_req1.fs_type != UV_FS_OPEN) goto LAB_001592ef;
    add_flags = (uv_file)open_req1.result;
    if (open_req1.result._4_4_ < 0) goto LAB_001592f4;
    open_cb_count = open_cb_count + 1;
    if (open_req1.path == (char *)0x0) goto LAB_001592f9;
    if (*(long *)(open_req1.path + 3) != 0x32656c69665f74 ||
        *(long *)open_req1.path != 0x6c69665f74736574) goto LAB_001592fe;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar6 = uv_buf_init(buf,0x20);
    iVar4 = 0x160e08;
    puVar2 = ::loop;
    iov = uVar6;
    iVar1 = uv_fs_read(::loop,&read_req,(uv_file)open_req1.result,&iov,1,-1,read_cb);
    add_flags = (uv_file)puVar2;
    if (iVar1 == 0) {
      return iVar4;
    }
  }
  else {
    open_cb_cold_1();
LAB_001592ef:
    add_flags = (uv_file)puVar2;
    open_cb_cold_2();
LAB_001592f4:
    open_cb_cold_6();
LAB_001592f9:
    open_cb_cold_5();
LAB_001592fe:
    open_cb_cold_3();
  }
  open_cb_cold_4();
  fs_file_sync(add_flags);
  fs_file_sync(add_flags);
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_file_sync_cold_1();
  unlink("test_file");
  unlink("test_file2");
  puVar2 = uv_default_loop();
  ::loop = puVar2;
  iVar1 = uv_fs_open(puVar2,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  iVar4 = (int)puVar2;
  if (iVar1 < 0) {
    fs_file_sync_cold_1();
LAB_0015975c:
    fs_file_sync_cold_2();
LAB_00159761:
    fs_file_sync_cold_3();
LAB_00159766:
    fs_file_sync_cold_4();
LAB_0015976b:
    fs_file_sync_cold_5();
LAB_00159770:
    fs_file_sync_cold_6();
LAB_00159775:
    fs_file_sync_cold_7();
LAB_0015977a:
    fs_file_sync_cold_8();
LAB_0015977f:
    fs_file_sync_cold_9();
LAB_00159784:
    fs_file_sync_cold_10();
LAB_00159789:
    fs_file_sync_cold_11();
LAB_0015978e:
    fs_file_sync_cold_12();
LAB_00159793:
    fs_file_sync_cold_13();
LAB_00159798:
    fs_file_sync_cold_14();
LAB_0015979d:
    fs_file_sync_cold_15();
LAB_001597a2:
    fs_file_sync_cold_16();
LAB_001597a7:
    fs_file_sync_cold_17();
LAB_001597ac:
    fs_file_sync_cold_18();
LAB_001597b1:
    fs_file_sync_cold_19();
LAB_001597b6:
    fs_file_sync_cold_20();
LAB_001597bb:
    fs_file_sync_cold_21();
LAB_001597c0:
    fs_file_sync_cold_22();
LAB_001597c5:
    fs_file_sync_cold_23();
LAB_001597ca:
    fs_file_sync_cold_24();
LAB_001597cf:
    fs_file_sync_cold_25();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015975c;
    uv_fs_req_cleanup(&open_req1);
    uVar6 = uv_buf_init(test_buf,0xd);
    iVar4 = 0;
    iov = uVar6;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00159761;
    if (write_req.result < 0) goto LAB_00159766;
    uv_fs_req_cleanup(&write_req);
    iVar4 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_0015976b;
    if (close_req.result != 0) goto LAB_00159770;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",2,0,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00159775;
    if (open_req1.result._4_4_ < 0) goto LAB_0015977a;
    uv_fs_req_cleanup(&open_req1);
    uVar6 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    iov = uVar6;
    iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar1 < 0) goto LAB_0015977f;
    if (read_req.result < 0) goto LAB_00159784;
    iVar4 = 0x3120e0;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00159789;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    iVar1 = uv_fs_ftruncate((uv_loop_t *)0x0,&ftruncate_req,(uv_file)open_req1.result,7,
                            (uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_0015978e;
    if (ftruncate_req.result != 0) goto LAB_00159793;
    uv_fs_req_cleanup(&ftruncate_req);
    iVar4 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00159798;
    if (close_req.result != 0) goto LAB_0015979d;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    iVar1 = uv_fs_rename((uv_loop_t *)0x0,&rename_req,"test_file","test_file2",(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_001597a2;
    if (rename_req.result != 0) goto LAB_001597a7;
    uv_fs_req_cleanup(&rename_req);
    iVar4 = 0;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0,0,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_001597ac;
    if (open_req1.result._4_4_ < 0) goto LAB_001597b1;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar6 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    iov = uVar6;
    iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar1 < 0) goto LAB_001597b6;
    if (read_req.result < 0) goto LAB_001597bb;
    if (buf._0_8_ != 0x75622d74736574) goto LAB_001597c0;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_001597c5;
    if (close_req.result != 0) goto LAB_001597ca;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    iVar1 = uv_fs_unlink((uv_loop_t *)0x0,&unlink_req,"test_file2",(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_001597cf;
    if (unlink_req.result == 0) {
      uv_fs_req_cleanup(&unlink_req);
      unlink("test_file");
      iVar1 = unlink("test_file2");
      return iVar1;
    }
  }
  fs_file_sync_cold_26();
  fs_file_write_null_buffer(iVar4);
  fs_file_write_null_buffer(iVar4);
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_file_write_null_buffer_cold_1();
  unlink("test_file");
  ::loop = uv_default_loop();
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar1 < 0) {
    fs_file_write_null_buffer_cold_1();
LAB_0015992e:
    fs_file_write_null_buffer_cold_2();
LAB_00159933:
    fs_file_write_null_buffer_cold_3();
LAB_00159938:
    fs_file_write_null_buffer_cold_4();
LAB_0015993d:
    fs_file_write_null_buffer_cold_5();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015992e;
    uv_fs_req_cleanup(&open_req1);
    uVar6 = uv_buf_init((char *)0x0,0);
    iov = uVar6;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00159933;
    if (write_req.result != 0) goto LAB_00159938;
    uv_fs_req_cleanup(&write_req);
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_0015993d;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      iVar1 = unlink("test_file");
      return iVar1;
    }
  }
  fs_file_write_null_buffer_cold_6();
  pcStackY_88 = "test_file";
  pcStackY_a0 = (code *)0x159960;
  unlink("test_dir/file1");
  pcStackY_a0 = (code *)0x15996c;
  unlink("test_dir/file2");
  puVar2 = (uv_loop_t *)0x1a35d9;
  pcStackY_a0 = (code *)0x15997b;
  rmdir("test_dir");
  pcStackY_a0 = (code *)0x159980;
  loop = (uv_fs_t *)uv_default_loop();
  pcStackY_a0 = (code *)0x1599a5;
  ::loop = (uv_loop_t *)loop;
  iVar1 = uv_fs_mkdir((uv_loop_t *)loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar1 == 0) {
    pcStackY_a0 = (code *)0x1599bb;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_00159dc8;
    loop = (uv_fs_t *)0x0;
    pcStackY_a0 = (code *)0x1599eb;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file1",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00159dcd;
    pcStackY_a0 = (code *)0x1599ff;
    uv_fs_req_cleanup(&open_req1);
    loop = (uv_fs_t *)0x0;
    pcStackY_a0 = (code *)0x159a15;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00159dd2;
    pcStackY_a0 = (code *)0x159a29;
    uv_fs_req_cleanup(&close_req);
    loop = (uv_fs_t *)0x0;
    pcStackY_a0 = (code *)0x159a4c;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file2",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00159dd7;
    pcStackY_a0 = (code *)0x159a60;
    uv_fs_req_cleanup(&open_req1);
    loop = (uv_fs_t *)0x0;
    pcStackY_a0 = (code *)0x159a76;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00159ddc;
    pcStackY_a0 = (code *)0x159a8a;
    uv_fs_req_cleanup(&close_req);
    pcStackY_a0 = (code *)0x159aad;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_scandir(::loop,&scandir_req,"test_dir",0,scandir_cb);
    if (iVar1 != 0) goto LAB_00159de1;
    pcStackY_a0 = (code *)0x159ac3;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (scandir_cb_count != 1) goto LAB_00159de6;
    loop = (uv_fs_t *)0x0;
    pcStackY_a0 = (code *)0x159aea;
    iVar1 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test_dir",0,(uv_fs_cb)0x0);
    if (iVar1 != 2) goto LAB_00159deb;
    if (scandir_req.result != 2) goto LAB_00159df0;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00159df5;
    pcStackY_a0 = (code *)0x159b1e;
    iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_98);
    if (iVar1 != -0xfff) {
      puVar2 = (uv_loop_t *)0x1a20e8;
      unaff_R14 = &scandir_req;
      unaff_R12 = "file2";
      do {
        loop = (uv_fs_t *)uStackY_98.name;
        pcVar3 = "file1";
        pcStackY_a0 = (code *)0x159b4c;
        iVar1 = strcmp(uStackY_98.name,"file1");
        if (iVar1 != 0) {
          pcVar3 = "file2";
          pcStackY_a0 = (code *)0x159b5b;
          iVar1 = strcmp((char *)loop,"file2");
          if (iVar1 != 0) {
            pcStackY_a0 = (code *)0x159dc3;
            run_test_fs_async_dir_cold_11();
            unaff_R15 = &uStackY_98;
            goto LAB_00159dc3;
          }
        }
        dent.name = (char *)(ulong)uStackY_98.type;
        pcStackY_a0 = (code *)0x159b6c;
        dent._8_8_ = pcVar3;
        assert_is_file_type(dent);
        pcStackY_a0 = (code *)0x159b77;
        iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_98);
        unaff_R15 = &uStackY_98;
      } while (iVar1 != -0xfff);
    }
    loop = &scandir_req;
    pcStackY_a0 = (code *)0x159b8a;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr != (void *)0x0) goto LAB_00159dfa;
    pcStackY_a0 = (code *)0x159bb9;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_stat(::loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_00159dff;
    pcStackY_a0 = (code *)0x159bcf;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_a0 = (code *)0x159bf0;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_stat(::loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_00159e04;
    pcStackY_a0 = (code *)0x159c06;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_a0 = (code *)0x159c27;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_lstat(::loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_00159e09;
    pcStackY_a0 = (code *)0x159c3d;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_a0 = (code *)0x159c5e;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_lstat(::loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_00159e0e;
    pcStackY_a0 = (code *)0x159c74;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (stat_cb_count != 4) goto LAB_00159e13;
    pcStackY_a0 = (code *)0x159ca2;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_unlink(::loop,&unlink_req,"test_dir/file1",unlink_cb);
    if (iVar1 != 0) goto LAB_00159e18;
    pcStackY_a0 = (code *)0x159cb8;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (unlink_cb_count != 1) goto LAB_00159e1d;
    pcStackY_a0 = (code *)0x159ce6;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_unlink(::loop,&unlink_req,"test_dir/file2",unlink_cb);
    if (iVar1 != 0) goto LAB_00159e22;
    pcStackY_a0 = (code *)0x159cfc;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (unlink_cb_count != 2) goto LAB_00159e27;
    pcStackY_a0 = (code *)0x159d2a;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_rmdir(::loop,&rmdir_req,"test_dir",rmdir_cb);
    if (iVar1 != 0) goto LAB_00159e2c;
    pcStackY_a0 = (code *)0x159d40;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (rmdir_cb_count != 1) goto LAB_00159e31;
    pcStackY_a0 = (code *)0x159d59;
    unlink("test_dir/file1");
    pcStackY_a0 = (code *)0x159d65;
    unlink("test_dir/file2");
    pcStackY_a0 = (code *)0x159d71;
    rmdir("test_dir");
    pcStackY_a0 = (code *)0x159d76;
    puVar2 = uv_default_loop();
    pcStackY_a0 = (code *)0x159d8a;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    pcStackY_a0 = (code *)0x159d94;
    uv_run(puVar2,UV_RUN_DEFAULT);
    pcStackY_a0 = (code *)0x159d99;
    loop = (uv_fs_t *)uv_default_loop();
    pcStackY_a0 = (code *)0x159da1;
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      pcStackY_a0 = (code *)0x159dae;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_00159dc3:
    pcStackY_a0 = (code *)0x159dc8;
    run_test_fs_async_dir_cold_1();
LAB_00159dc8:
    pcStackY_a0 = (code *)0x159dcd;
    run_test_fs_async_dir_cold_2();
LAB_00159dcd:
    pcStackY_a0 = (code *)0x159dd2;
    run_test_fs_async_dir_cold_3();
LAB_00159dd2:
    pcStackY_a0 = (code *)0x159dd7;
    run_test_fs_async_dir_cold_4();
LAB_00159dd7:
    pcStackY_a0 = (code *)0x159ddc;
    run_test_fs_async_dir_cold_5();
LAB_00159ddc:
    pcStackY_a0 = (code *)0x159de1;
    run_test_fs_async_dir_cold_6();
LAB_00159de1:
    pcStackY_a0 = (code *)0x159de6;
    run_test_fs_async_dir_cold_7();
LAB_00159de6:
    pcStackY_a0 = (code *)0x159deb;
    run_test_fs_async_dir_cold_8();
LAB_00159deb:
    pcStackY_a0 = (code *)0x159df0;
    run_test_fs_async_dir_cold_9();
LAB_00159df0:
    pcStackY_a0 = (code *)0x159df5;
    run_test_fs_async_dir_cold_10();
LAB_00159df5:
    pcStackY_a0 = (code *)0x159dfa;
    run_test_fs_async_dir_cold_25();
LAB_00159dfa:
    pcStackY_a0 = (code *)0x159dff;
    run_test_fs_async_dir_cold_12();
LAB_00159dff:
    pcStackY_a0 = (code *)0x159e04;
    run_test_fs_async_dir_cold_13();
LAB_00159e04:
    pcStackY_a0 = (code *)0x159e09;
    run_test_fs_async_dir_cold_14();
LAB_00159e09:
    pcStackY_a0 = (code *)0x159e0e;
    run_test_fs_async_dir_cold_15();
LAB_00159e0e:
    pcStackY_a0 = (code *)0x159e13;
    run_test_fs_async_dir_cold_16();
LAB_00159e13:
    pcStackY_a0 = (code *)0x159e18;
    run_test_fs_async_dir_cold_17();
LAB_00159e18:
    pcStackY_a0 = (code *)0x159e1d;
    run_test_fs_async_dir_cold_18();
LAB_00159e1d:
    pcStackY_a0 = (code *)0x159e22;
    run_test_fs_async_dir_cold_19();
LAB_00159e22:
    pcStackY_a0 = (code *)0x159e27;
    run_test_fs_async_dir_cold_20();
LAB_00159e27:
    pcStackY_a0 = (code *)0x159e2c;
    run_test_fs_async_dir_cold_21();
LAB_00159e2c:
    pcStackY_a0 = (code *)0x159e31;
    run_test_fs_async_dir_cold_22();
LAB_00159e31:
    pcStackY_a0 = (code *)0x159e36;
    run_test_fs_async_dir_cold_23();
  }
  pcStackY_a0 = mkdir_cb;
  run_test_fs_async_dir_cold_24();
  if (loop == &mkdir_req) {
    if (mkdir_req.fs_type != UV_FS_MKDIR) goto LAB_00159e95;
    if (mkdir_req.result != 0) goto LAB_00159e9a;
    mkdir_cb_count = mkdir_cb_count + 1;
    if (mkdir_req.path == (char *)0x0) goto LAB_00159e9f;
    if (mkdir_req.path[8] == '\0' && *(long *)mkdir_req.path == 0x7269645f74736574) {
      uv_fs_req_cleanup(&mkdir_req);
      return extraout_EAX_00;
    }
  }
  else {
    pcStackY_a8 = (code *)0x159e95;
    mkdir_cb_cold_1();
LAB_00159e95:
    pcStackY_a8 = (code *)0x159e9a;
    mkdir_cb_cold_2();
LAB_00159e9a:
    pcStackY_a8 = (code *)0x159e9f;
    mkdir_cb_cold_3();
LAB_00159e9f:
    pcStackY_a8 = (code *)0x159ea4;
    mkdir_cb_cold_5();
  }
  pcStackY_a8 = scandir_cb;
  mkdir_cb_cold_4();
  puStackY_c8 = puVar2;
  pcStackY_c0 = unaff_R12;
  puStackY_b0 = unaff_R14;
  pcStackY_a8 = (code *)unaff_R15;
  if (loop == &scandir_req) {
    puVar5 = loop;
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00159fb0;
    if (scandir_req.result != 2) goto LAB_00159fb5;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00159fba;
    puVar5 = &scandir_req;
    iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_d8);
    loop = (uv_fs_t *)uStackY_d8.name;
    while (iVar1 != -0xfff) {
      pcVar3 = "file1";
      uStackY_d8.name = (char *)loop;
      iVar1 = strcmp((char *)loop,"file1");
      if (iVar1 != 0) {
        pcVar3 = "file2";
        iVar1 = strcmp((char *)loop,"file2");
        if (iVar1 != 0) {
          scandir_cb_cold_4();
          goto LAB_00159fab;
        }
      }
      dent_00.name = (char *)(ulong)uStackY_d8.type;
      dent_00._8_8_ = pcVar3;
      assert_is_file_type(dent_00);
      puVar5 = &scandir_req;
      iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_d8);
      loop = (uv_fs_t *)uStackY_d8.name;
    }
    scandir_cb_count = scandir_cb_count + 1;
    if ((long *)scandir_req.path == (long *)0x0) goto LAB_00159fbf;
    if ((char)*(long *)((long)scandir_req.path + 8) != '\0' ||
        *(long *)scandir_req.path != 0x7269645f74736574) goto LAB_00159fc4;
    puVar5 = &scandir_req;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr == (void *)0x0) {
      return extraout_EAX_01;
    }
  }
  else {
LAB_00159fab:
    scandir_cb_cold_1();
    puVar5 = loop;
LAB_00159fb0:
    scandir_cb_cold_2();
LAB_00159fb5:
    scandir_cb_cold_3();
LAB_00159fba:
    scandir_cb_cold_8();
LAB_00159fbf:
    scandir_cb_cold_7();
LAB_00159fc4:
    scandir_cb_cold_5();
  }
  scandir_cb_cold_6();
  if ((uint)puVar5 < 2) {
    return extraout_EAX_02;
  }
  assert_is_file_type_cold_1();
  if (puVar5 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_0015a02c;
    if (stat_req.result != 0) goto LAB_0015a031;
    if (stat_req.ptr == (void *)0x0) goto LAB_0015a036;
    stat_cb_count = stat_cb_count + 1;
    puVar5 = &stat_req;
    uv_fs_req_cleanup(&stat_req);
    if (stat_req.ptr == (void *)0x0) {
      return extraout_EAX_03;
    }
  }
  else {
    stat_cb_cold_1();
LAB_0015a02c:
    stat_cb_cold_2();
LAB_0015a031:
    stat_cb_cold_3();
LAB_0015a036:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (puVar5 == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_0015a078;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return extraout_EAX_04;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_0015a078:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (puVar5 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_0015a0dc;
    if (rmdir_req.result != 0) goto LAB_0015a0e1;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        uv_fs_req_cleanup(&rmdir_req);
        return extraout_EAX_05;
      }
      goto LAB_0015a0eb;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_0015a0dc:
    rmdir_cb_cold_2();
LAB_0015a0e1:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_0015a0eb:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x10009);
  return 0;
}

Assistant:

TEST_IMPL(fs_file_async) {
  int r;

  /* Setup. */
  unlink("test_file");
  unlink("test_file2");

  loop = uv_default_loop();

  r = uv_fs_open(loop, &open_req1, "test_file", O_WRONLY | O_CREAT,
      S_IRUSR | S_IWUSR, create_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(create_cb_count == 1);
  ASSERT(write_cb_count == 1);
  ASSERT(fsync_cb_count == 1);
  ASSERT(fdatasync_cb_count == 1);
  ASSERT(close_cb_count == 1);

  r = uv_fs_rename(loop, &rename_req, "test_file", "test_file2", rename_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(create_cb_count == 1);
  ASSERT(write_cb_count == 1);
  ASSERT(close_cb_count == 1);
  ASSERT(rename_cb_count == 1);

  r = uv_fs_open(loop, &open_req1, "test_file2", O_RDWR, 0, open_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(open_cb_count == 1);
  ASSERT(read_cb_count == 1);
  ASSERT(close_cb_count == 2);
  ASSERT(rename_cb_count == 1);
  ASSERT(create_cb_count == 1);
  ASSERT(write_cb_count == 1);
  ASSERT(ftruncate_cb_count == 1);

  r = uv_fs_open(loop, &open_req1, "test_file2", O_RDONLY, 0, open_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(open_cb_count == 2);
  ASSERT(read_cb_count == 2);
  ASSERT(close_cb_count == 3);
  ASSERT(rename_cb_count == 1);
  ASSERT(unlink_cb_count == 1);
  ASSERT(create_cb_count == 1);
  ASSERT(write_cb_count == 1);
  ASSERT(ftruncate_cb_count == 1);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file2");

  MAKE_VALGRIND_HAPPY();
  return 0;
}